

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdTruth6Compose_rec(word Func,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong *puVar6;
  word local_438 [64];
  word local_238 [65];
  
  lVar3 = ~(ulong)(nVars - 1) << 9;
  lVar5 = (ulong)(nVars - 1) + 1;
  do {
    if (Func == 0xffffffffffffffff) {
      if (nWordsR < 1) {
        return;
      }
      iVar4 = 0xff;
LAB_00495ee1:
      memset(pRes,iVar4,(ulong)(uint)nWordsR << 3);
      return;
    }
    if (Func == 0) {
      if (nWordsR < 1) {
        return;
      }
      iVar4 = 0;
      goto LAB_00495ee1;
    }
    if ((int)lVar5 < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x1e1,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
    }
    if ((int)lVar5 == 1) {
      if ((Func != 0x5555555555555555) && (s_Truths6[0] != Func)) {
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x1e4,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
      }
      if (Func != 0x5555555555555555) {
        if (nWordsR < 1) {
          return;
        }
        uVar2 = 0;
        do {
          pRes[uVar2] = (*pFanins)[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)nWordsR != uVar2);
        return;
      }
      if (nWordsR < 1) {
        return;
      }
      uVar2 = 0;
      do {
        pRes[uVar2] = ~(*pFanins)[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)nWordsR != uVar2);
      return;
    }
    lVar5 = lVar5 + -1;
    iVar4 = (int)lVar5;
    bVar1 = (byte)(1 << ((byte)lVar5 & 0x1f));
    lVar3 = lVar3 + 0x200;
    if ((s_Truths6Neg[iVar4] & (Func >> (bVar1 & 0x3f) ^ Func)) != 0) {
      if (iVar4 + 1U < 7) {
        Dau_DsdTruth6Compose_rec
                  ((s_Truths6Neg[lVar5] & Func) << (bVar1 & 0x3f) | s_Truths6Neg[lVar5] & Func,
                   pFanins,local_438,iVar4,nWordsR);
        Dau_DsdTruth6Compose_rec
                  ((Func & s_Truths6[lVar5]) >> (bVar1 & 0x3f) | Func & s_Truths6[lVar5],pFanins,
                   local_238,iVar4,nWordsR);
        if (0 < nWordsR) {
          puVar6 = (ulong *)((long)pFanins - lVar3);
          uVar2 = 0;
          do {
            pRes[uVar2] = (local_238[uVar2] ^ local_438[uVar2]) & *puVar6 ^ local_438[uVar2];
            uVar2 = uVar2 + 1;
            puVar6 = puVar6 + 1;
          } while ((uint)nWordsR != uVar2);
        }
        return;
      }
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
    }
  } while( true );
}

Assistant:

void Dau_DsdTruth6Compose_rec( word Func, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    if ( Func == 0 )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Func == ~(word)0 )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        Abc_TtCopy( pRes, pFanins[0], nWordsR, Func == s_Truths6Neg[0] );
        return;
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
    {
        Dau_DsdTruth6Compose_rec( Func, pFanins, pRes, nVars, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}